

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * __thiscall mocker::Lexer::nextToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  StrIter tmpNxtBeg;
  StrIter tmpCurBeg;
  Position tmpNxtPos;
  Position tmpCurPos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  size_t local_98;
  size_t sStack_90;
  Position local_88;
  tuple<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  local_70;
  tuple<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  local_50;
  
  local_a0._M_current = (this->curBeg)._M_current;
  local_a8._M_current = (this->nxtBeg)._M_current;
  local_88.line = (this->curPos).line;
  local_88.col = (this->curPos).col;
  local_98 = (this->nxtPos).line;
  sStack_90 = (this->nxtPos).col;
  getToken_abi_cxx11_(__return_storage_ptr__,this);
  local_50.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_false>
  ._M_head_impl = &local_a8;
  local_50.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_false>
  ._M_head_impl = &local_a0;
  local_70.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .super__Tuple_impl<2UL,_mocker::Position_&,_mocker::Position_&>.
  super__Tuple_impl<3UL,_mocker::Position_&>.super__Head_base<3UL,_mocker::Position_&,_false>.
  _M_head_impl = (_Head_base<3UL,_mocker::Position_&,_false>)
                 (_Head_base<3UL,_mocker::Position_&,_false>)&this->nxtPos;
  local_70.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .super__Tuple_impl<2UL,_mocker::Position_&,_mocker::Position_&>.
  super__Head_base<2UL,_mocker::Position_&,_false>._M_head_impl = &this->curPos;
  local_70.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_false>
  ._M_head_impl = &this->nxtBeg;
  local_70.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_false>
  ._M_head_impl = &this->curBeg;
  local_50.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .super__Tuple_impl<2UL,_mocker::Position_&,_mocker::Position_&>.
  super__Tuple_impl<3UL,_mocker::Position_&>.super__Head_base<3UL,_mocker::Position_&,_false>.
  _M_head_impl = (_Head_base<3UL,_mocker::Position_&,_false>)(Position *)&local_98;
  local_50.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  .super__Tuple_impl<2UL,_mocker::Position_&,_mocker::Position_&>.
  super__Head_base<2UL,_mocker::Position_&,_false>._M_head_impl = &local_88;
  std::
  tuple<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  ::operator=(&local_70,&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::nextToken() {
  auto tmpCurBeg = curBeg;
  auto tmpNxtBeg = nxtBeg;
  auto tmpCurPos = curPos;
  auto tmpNxtPos = nxtPos;
  auto res = getToken();
  std::tie(curBeg, nxtBeg, curPos, nxtPos) =
      std::tie(tmpCurBeg, tmpNxtBeg, tmpCurPos, tmpNxtPos);
  return res;
}